

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall add::add(add *this)

{
  add *this_local;
  
  node::node(&this->super_node);
  (this->super_node)._vptr_node = (_func_int **)&PTR_forward_001148f0;
  return;
}

Assistant:

tensor* forward(vector<tensor *> x){
        isbuild=true;
        grad_fn.resize(x.size());
        input = x;
        ret = new tensor(0);
        for(int i=0;i<input.size();i++){
            ret->data+=input[i]->data;
            grad_fn[i]=1;
            input[i]->cnt++;
            input[i]->cnt_free++;
        }
        ret->hook=this;
        return ret;
    }